

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_CutComputeTruthMux6
              (Lf_Man_t *p,Lf_Cut_t *pCut0,Lf_Cut_t *pCut1,Lf_Cut_t *pCutC,int fCompl0,int fCompl1,
              int fComplC,Lf_Cut_t *pCutR)

{
  int iVar1;
  word *pwVar2;
  word wVar3;
  word wVar4;
  word wVar5;
  word local_60;
  word tC;
  word t1;
  word t0;
  word t;
  int local_38;
  int fCompl;
  int truthId;
  int nOldSupp;
  int fCompl1_local;
  int fCompl0_local;
  Lf_Cut_t *pCutC_local;
  Lf_Cut_t *pCut1_local;
  Lf_Cut_t *pCut0_local;
  Lf_Man_t *p_local;
  
  fCompl = *(uint *)&pCutR->field_0x14 >> 0x18;
  truthId = fCompl1;
  nOldSupp = fCompl0;
  _fCompl1_local = pCutC;
  pCutC_local = pCut1;
  pCut1_local = pCut0;
  pCut0_local = (Lf_Cut_t *)p;
  pwVar2 = Lf_CutTruth(p,pCut0);
  t1 = *pwVar2;
  pwVar2 = Lf_CutTruth((Lf_Man_t *)pCut0_local,pCutC_local);
  tC = *pwVar2;
  pwVar2 = Lf_CutTruth((Lf_Man_t *)pCut0_local,_fCompl1_local);
  local_60 = *pwVar2;
  iVar1 = Abc_LitIsCompl(pCut1_local->iFunc);
  if (iVar1 != nOldSupp) {
    t1 = t1 ^ 0xffffffffffffffff;
  }
  iVar1 = Abc_LitIsCompl(pCutC_local->iFunc);
  if (iVar1 != truthId) {
    tC = tC ^ 0xffffffffffffffff;
  }
  iVar1 = Abc_LitIsCompl(_fCompl1_local->iFunc);
  if (iVar1 != fComplC) {
    local_60 = local_60 ^ 0xffffffffffffffff;
  }
  wVar3 = Abc_Tt6Expand(t1,(int *)(pCut1_local + 1),*(uint *)&pCut1_local->field_0x14 >> 0x18,
                        (int *)(pCutR + 1),*(uint *)&pCutR->field_0x14 >> 0x18);
  wVar4 = Abc_Tt6Expand(tC,(int *)(pCutC_local + 1),*(uint *)&pCutC_local->field_0x14 >> 0x18,
                        (int *)(pCutR + 1),*(uint *)&pCutR->field_0x14 >> 0x18);
  wVar5 = Abc_Tt6Expand(local_60,(int *)(_fCompl1_local + 1),
                        *(uint *)&_fCompl1_local->field_0x14 >> 0x18,(int *)(pCutR + 1),
                        *(uint *)&pCutR->field_0x14 >> 0x18);
  t0 = wVar5 & wVar4 | (wVar5 ^ 0xffffffffffffffff) & wVar3;
  t._4_4_ = (uint)t0 & 1;
  if ((t0 & 1) != 0) {
    t0 = t0 ^ 0xffffffffffffffff;
  }
  iVar1 = Abc_Tt6MinBase(&t0,(int *)(pCutR + 1),*(uint *)&pCutR->field_0x14 >> 0x18);
  *(uint *)&pCutR->field_0x14 = *(uint *)&pCutR->field_0x14 & 0xffffff | iVar1 << 0x18;
  if ((t0 & 1) == 0) {
    local_38 = Vec_MemHashInsert(*(Vec_Mem_t **)&pCut0_local[2].iFunc,&t0);
    iVar1 = Abc_Var2Lit(local_38,t._4_4_);
    pCutR->iFunc = iVar1;
    if ((int)(*(uint *)&pCutR->field_0x14 >> 0x18) <= fCompl) {
      return (int)((int)(*(uint *)&pCutR->field_0x14 >> 0x18) < fCompl);
    }
    __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x407,
                  "int Lf_CutComputeTruthMux6(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, int, Lf_Cut_t *)"
                 );
  }
  __assert_fail("(int)(t & 1) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                ,0x404,
                "int Lf_CutComputeTruthMux6(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, int, Lf_Cut_t *)"
               );
}

Assistant:

static inline int Lf_CutComputeTruthMux6( Lf_Man_t * p, Lf_Cut_t * pCut0, Lf_Cut_t * pCut1, Lf_Cut_t * pCutC, int fCompl0, int fCompl1, int fComplC, Lf_Cut_t * pCutR )
{
    int nOldSupp = pCutR->nLeaves, truthId, fCompl; word t;
    word t0 = *Lf_CutTruth(p, pCut0);
    word t1 = *Lf_CutTruth(p, pCut1);
    word tC = *Lf_CutTruth(p, pCutC);
    if ( Abc_LitIsCompl(pCut0->iFunc) ^ fCompl0 ) t0 = ~t0;
    if ( Abc_LitIsCompl(pCut1->iFunc) ^ fCompl1 ) t1 = ~t1;
    if ( Abc_LitIsCompl(pCutC->iFunc) ^ fComplC ) tC = ~tC;
    t0 = Abc_Tt6Expand( t0, pCut0->pLeaves, pCut0->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    t1 = Abc_Tt6Expand( t1, pCut1->pLeaves, pCut1->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    tC = Abc_Tt6Expand( tC, pCutC->pLeaves, pCutC->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    t = (tC & t1) | (~tC & t0);
    if ( (fCompl = (int)(t & 1)) ) t = ~t;
    pCutR->nLeaves = Abc_Tt6MinBase( &t, pCutR->pLeaves, pCutR->nLeaves );
    assert( (int)(t & 1) == 0 );
    truthId        = Vec_MemHashInsert(p->vTtMem, &t);
    pCutR->iFunc   = Abc_Var2Lit( truthId, fCompl );
    assert( (int)pCutR->nLeaves <= nOldSupp );
    return (int)pCutR->nLeaves < nOldSupp;
}